

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O3

blargg_err_t __thiscall Snes_Spc::play(Snes_Spc *this,int count,sample_t_conflict1 *out)

{
  blargg_err_t pcVar1;
  
  if (count != 0) {
    set_output(this,out,count);
    end_frame(this,count << 4);
  }
  pcVar1 = (this->m).cpu_error;
  (this->m).cpu_error = (char *)0x0;
  return pcVar1;
}

Assistant:

blargg_err_t Snes_Spc::play( int count, sample_t* out )
{
	require( (count & 1) == 0 ); // must be even
	if ( count )
	{
		set_output( out, count );
		end_frame( count * (clocks_per_sample / 2) );
	}
	
	const char* err = m.cpu_error;
	m.cpu_error = 0;
	return err;
}